

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::sse2::
     BVHNIntersector1<4,_1,_false,_embree::sse2::ArrayIntersector1<embree::sse2::QuadMvIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  Geometry *this;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 (*pauVar7) [16];
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  undefined1 (*pauVar15) [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar28;
  float fVar29;
  undefined1 auVar26 [16];
  float fVar30;
  undefined1 auVar27 [16];
  float fVar31;
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar38;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined4 local_101c;
  float local_ff8 [4];
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [8];
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  ulong local_fa0;
  ulong local_f98;
  ulong local_f90;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  ulong local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f90 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f90 == 8) {
    return false;
  }
  local_f78 = local_f90;
  uStack_f70 = 0;
  uVar1 = *(undefined4 *)&(query->p).field_0;
  fVar2 = (query->p).field_0.field_0.y;
  fVar3 = (query->p).field_0.field_0.z;
  local_fb8 = (context->query_radius).field_0.m128[0];
  local_f88 = (context->query_radius).field_0.m128[1];
  fStack_fe4 = *(float *)((long)&(context->query_radius).field_0 + 8);
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    _local_fc8 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    fVar17 = (context->query_radius).field_0.m128[0];
    fVar18 = (context->query_radius).field_0.m128[1];
    fStack_fc0 = (context->query_radius).field_0.m128[2];
    local_fc8._4_4_ = (context->query_radius).field_0.m128[3];
    fStack_fc0 = fStack_fc0 * fStack_fc0;
    local_fc8._4_4_ = (float)local_fc8._4_4_ * (float)local_fc8._4_4_;
    local_fc8._0_4_ = fStack_fc0 + fVar18 * fVar18 + fVar17 * fVar17;
    fStack_fbc = (float)local_fc8._4_4_;
  }
  pauVar15 = (undefined1 (*) [16])local_f68;
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar46._4_4_ = fVar2;
  auVar46._0_4_ = fVar2;
  auVar46._8_4_ = fVar2;
  auVar46._12_4_ = fVar2;
  auVar43._4_4_ = fVar3;
  auVar43._0_4_ = fVar3;
  auVar43._8_4_ = fVar3;
  auVar43._12_4_ = fVar3;
  local_fe8 = fStack_fe4;
  fStack_fe0 = fStack_fe4;
  fStack_fdc = fStack_fe4;
  fVar16 = local_fb8 * local_fb8;
  local_101c = 0;
  local_fd8 = auVar22;
  fVar17 = fVar16;
  fVar18 = fVar16;
  fVar19 = fVar16;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_f84 = local_f88;
  fStack_f80 = local_f88;
  fStack_f7c = local_f88;
LAB_00d0d5bb:
  fVar48 = auVar22._0_4_;
  fVar49 = auVar22._4_4_;
  fVar50 = auVar22._8_4_;
  fVar51 = auVar22._12_4_;
  while( true ) {
    pauVar7 = pauVar15 + -1;
    pauVar15 = pauVar15 + -1;
    if ((float)local_fc8._0_4_ < *(float *)((long)*pauVar7 + 8)) break;
    uVar10 = *(ulong *)*pauVar15;
LAB_00d0d609:
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      if ((uVar10 & 8) != 0) {
LAB_00d0da51:
        local_f90 = (ulong)((uint)uVar10 & 0xf) - 8;
        local_fa0 = local_f90;
        if (local_f90 == 0) break;
        lVar12 = (uVar10 & 0xfffffffffffffff0) + 0xd0;
        local_f90 = 0;
        uVar10 = 0;
        goto LAB_00d0da80;
      }
      auVar20 = *(undefined1 (*) [16])(uVar10 + 0x20);
      auVar24 = *(undefined1 (*) [16])(uVar10 + 0x30);
      auVar26 = maxps(auVar22,auVar20);
      auVar26 = minps(auVar26,auVar24);
      fVar25 = auVar26._0_4_ - auVar22._0_4_;
      fVar28 = auVar26._4_4_ - auVar22._4_4_;
      fVar29 = auVar26._8_4_ - auVar22._8_4_;
      fVar30 = auVar26._12_4_ - auVar22._12_4_;
      auVar26 = maxps(auVar46,*(undefined1 (*) [16])(uVar10 + 0x40));
      auVar26 = minps(auVar26,*(undefined1 (*) [16])(uVar10 + 0x50));
      fVar31 = auVar26._0_4_ - fVar2;
      fVar35 = auVar26._4_4_ - fVar2;
      fVar36 = auVar26._8_4_ - fVar2;
      fVar37 = auVar26._12_4_ - fVar2;
      auVar26 = maxps(auVar43,*(undefined1 (*) [16])(uVar10 + 0x60));
      auVar26 = minps(auVar26,*(undefined1 (*) [16])(uVar10 + 0x70));
      fVar38 = auVar26._0_4_ - fVar3;
      fVar40 = auVar26._4_4_ - fVar3;
      fVar41 = auVar26._8_4_ - fVar3;
      fVar42 = auVar26._12_4_ - fVar3;
      local_ff8[0] = fVar38 * fVar38 + fVar31 * fVar31 + fVar25 * fVar25;
      local_ff8[1] = fVar40 * fVar40 + fVar35 * fVar35 + fVar28 * fVar28;
      local_ff8[2] = fVar41 * fVar41 + fVar36 * fVar36 + fVar29 * fVar29;
      local_ff8[3] = fVar42 * fVar42 + fVar37 * fVar37 + fVar30 * fVar30;
      bVar5 = auVar20._0_4_ <= auVar24._0_4_ && local_ff8[0] <= fVar16;
      bVar6 = auVar20._4_4_ <= auVar24._4_4_ && local_ff8[1] <= fVar17;
      bVar4 = auVar20._8_4_ <= auVar24._8_4_ && local_ff8[2] <= fVar18;
      bVar8 = auVar20._12_4_ <= auVar24._12_4_ && local_ff8[3] <= fVar19;
    }
    else {
      if ((uVar10 & 8) != 0) goto LAB_00d0da51;
      auVar20 = *(undefined1 (*) [16])(uVar10 + 0x60);
      auVar24 = *(undefined1 (*) [16])(uVar10 + 0x20);
      auVar26 = *(undefined1 (*) [16])(uVar10 + 0x30);
      auVar45 = *(undefined1 (*) [16])(uVar10 + 0x40);
      auVar32 = *(undefined1 (*) [16])(uVar10 + 0x50);
      auVar23 = *(undefined1 (*) [16])(uVar10 + 0x70);
      auVar47 = maxps(auVar22,auVar24);
      auVar47 = minps(auVar47,auVar26);
      fVar25 = auVar47._0_4_ - auVar22._0_4_;
      fVar29 = auVar47._4_4_ - auVar22._4_4_;
      fVar31 = auVar47._8_4_ - auVar22._8_4_;
      fVar36 = auVar47._12_4_ - auVar22._12_4_;
      auVar22 = maxps(auVar46,auVar45);
      auVar22 = minps(auVar22,auVar32);
      fVar38 = auVar22._0_4_ - fVar2;
      fVar40 = auVar22._4_4_ - fVar2;
      fVar41 = auVar22._8_4_ - fVar2;
      fVar42 = auVar22._12_4_ - fVar2;
      auVar22 = maxps(auVar43,auVar20);
      auVar22 = minps(auVar22,auVar23);
      fVar28 = auVar22._0_4_ - fVar3;
      fVar30 = auVar22._4_4_ - fVar3;
      fVar35 = auVar22._8_4_ - fVar3;
      fVar37 = auVar22._12_4_ - fVar3;
      local_ff8[0] = fVar28 * fVar28 + fVar38 * fVar38 + fVar25 * fVar25;
      local_ff8[1] = fVar30 * fVar30 + fVar40 * fVar40 + fVar29 * fVar29;
      local_ff8[2] = fVar35 * fVar35 + fVar41 * fVar41 + fVar31 * fVar31;
      local_ff8[3] = fVar37 * fVar37 + fVar42 * fVar42 + fVar36 * fVar36;
      bVar5 = ((auVar20._0_4_ <= fVar3 + local_fe8 && fVar48 - local_fb8 <= auVar26._0_4_) &&
              (auVar24._0_4_ <= fVar48 + local_fb8 && auVar45._0_4_ <= fVar2 + local_f88)) &&
              (fVar3 - local_fe8 <= auVar23._0_4_ &&
              (auVar24._0_4_ <= auVar26._0_4_ && fVar2 - local_f88 <= auVar32._0_4_));
      bVar6 = ((auVar20._4_4_ <= fVar3 + fStack_fe4 && fVar49 - fStack_fb4 <= auVar26._4_4_) &&
              (auVar24._4_4_ <= fVar49 + fStack_fb4 && auVar45._4_4_ <= fVar2 + fStack_f84)) &&
              (fVar3 - fStack_fe4 <= auVar23._4_4_ &&
              (auVar24._4_4_ <= auVar26._4_4_ && fVar2 - fStack_f84 <= auVar32._4_4_));
      bVar4 = ((auVar20._8_4_ <= fVar3 + fStack_fe0 && fVar50 - fStack_fb0 <= auVar26._8_4_) &&
              (auVar24._8_4_ <= fVar50 + fStack_fb0 && auVar45._8_4_ <= fVar2 + fStack_f80)) &&
              (fVar3 - fStack_fe0 <= auVar23._8_4_ &&
              (auVar24._8_4_ <= auVar26._8_4_ && fVar2 - fStack_f80 <= auVar32._8_4_));
      bVar8 = ((auVar20._12_4_ <= fVar3 + fStack_fdc && fVar51 - fStack_fac <= auVar26._12_4_) &&
              (auVar24._12_4_ <= fVar51 + fStack_fac && auVar45._12_4_ <= fVar2 + fStack_f7c)) &&
              (fVar3 - fStack_fdc <= auVar23._12_4_ &&
              (auVar24._12_4_ <= auVar26._12_4_ && fVar2 - fStack_f7c <= auVar32._12_4_));
      auVar22 = local_fd8;
    }
    auVar20._0_4_ = (uint)bVar5 * -0x80000000;
    auVar20._4_4_ = (uint)bVar6 * -0x80000000;
    auVar20._8_4_ = (uint)bVar4 * -0x80000000;
    auVar20._12_4_ = (uint)bVar8 * -0x80000000;
    uVar9 = movmskps((int)local_f90,auVar20);
    local_f90 = (ulong)uVar9;
    if (uVar9 != 0) {
      uVar11 = uVar10 & 0xfffffffffffffff0;
      lVar12 = 0;
      if ((byte)uVar9 != 0) {
        for (; ((byte)uVar9 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
        }
      }
      local_f90 = *(ulong *)(uVar11 + lVar12 * 8);
      uVar9 = (uVar9 & 0xff) - 1 & uVar9 & 0xff;
      uVar10 = local_f90;
      if (uVar9 != 0) {
        fVar25 = local_ff8[lVar12];
        lVar12 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        uVar10 = *(ulong *)(uVar11 + lVar12 * 8);
        fVar28 = local_ff8[lVar12];
        uVar9 = uVar9 - 1 & uVar9;
        if (uVar9 == 0) {
          if ((uint)fVar25 < (uint)fVar28) {
            *(ulong *)*pauVar15 = uVar10;
            *(float *)((long)*pauVar15 + 8) = fVar28;
            uVar10 = local_f90;
            pauVar15 = pauVar15 + 1;
          }
          else {
            *(ulong *)*pauVar15 = local_f90;
            *(float *)((long)*pauVar15 + 8) = fVar25;
            local_f90 = uVar10;
            pauVar15 = pauVar15 + 1;
          }
        }
        else {
          auVar24._8_4_ = fVar25;
          auVar24._0_8_ = local_f90;
          auVar24._12_4_ = 0;
          auVar26._8_4_ = fVar28;
          auVar26._0_8_ = uVar10;
          auVar26._12_4_ = 0;
          lVar12 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          uVar10 = *(ulong *)(uVar11 + lVar12 * 8);
          fVar29 = local_ff8[lVar12];
          auVar45._8_4_ = fVar29;
          auVar45._0_8_ = uVar10;
          auVar45._12_4_ = 0;
          auVar32._8_4_ = -(uint)((int)fVar25 < (int)fVar28);
          uVar9 = uVar9 - 1 & uVar9;
          if (uVar9 == 0) {
            auVar32._4_4_ = auVar32._8_4_;
            auVar32._0_4_ = auVar32._8_4_;
            auVar32._12_4_ = auVar32._8_4_;
            auVar20 = auVar24 & auVar32 | ~auVar32 & auVar26;
            auVar24 = auVar26 & auVar32 | ~auVar32 & auVar24;
            auVar33._8_4_ = -(uint)(auVar20._8_4_ < (int)fVar29);
            auVar33._0_8_ = CONCAT44(auVar33._8_4_,auVar33._8_4_);
            auVar33._12_4_ = auVar33._8_4_;
            local_f90 = ~auVar33._0_8_ & uVar10 | auVar20._0_8_ & auVar33._0_8_;
            auVar20 = auVar45 & auVar33 | ~auVar33 & auVar20;
            auVar21._8_4_ = -(uint)(auVar24._8_4_ < auVar20._8_4_);
            auVar21._4_4_ = auVar21._8_4_;
            auVar21._0_4_ = auVar21._8_4_;
            auVar21._12_4_ = auVar21._8_4_;
            *pauVar15 = ~auVar21 & auVar24 | auVar20 & auVar21;
            pauVar15[1] = auVar24 & auVar21 | ~auVar21 & auVar20;
            pauVar15 = pauVar15 + 2;
            uVar10 = local_f90;
          }
          else {
            lVar12 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            fVar25 = local_ff8[lVar12];
            auVar39._8_4_ = fVar25;
            auVar39._0_8_ = *(undefined8 *)(uVar11 + lVar12 * 8);
            auVar39._12_4_ = 0;
            auVar34._4_4_ = auVar32._8_4_;
            auVar34._0_4_ = auVar32._8_4_;
            auVar34._8_4_ = auVar32._8_4_;
            auVar34._12_4_ = auVar32._8_4_;
            auVar22 = auVar24 & auVar34 | ~auVar34 & auVar26;
            auVar20 = auVar26 & auVar34 | ~auVar34 & auVar24;
            auVar44._0_4_ = -(uint)((int)fVar29 < (int)fVar25);
            auVar44._4_4_ = -(uint)((int)fVar29 < (int)fVar25);
            auVar44._8_4_ = -(uint)((int)fVar29 < (int)fVar25);
            auVar44._12_4_ = -(uint)((int)fVar29 < (int)fVar25);
            auVar24 = auVar45 & auVar44 | ~auVar44 & auVar39;
            auVar45 = ~auVar44 & auVar45 | auVar39 & auVar44;
            auVar27._8_4_ = -(uint)(auVar20._8_4_ < auVar45._8_4_);
            auVar27._4_4_ = auVar27._8_4_;
            auVar27._0_4_ = auVar27._8_4_;
            auVar27._12_4_ = auVar27._8_4_;
            auVar26 = auVar20 & auVar27 | ~auVar27 & auVar45;
            auVar47._8_4_ = -(uint)(auVar22._8_4_ < auVar24._8_4_);
            auVar47._0_8_ = CONCAT44(auVar47._8_4_,auVar47._8_4_);
            auVar47._12_4_ = auVar47._8_4_;
            local_f90 = auVar22._0_8_ & auVar47._0_8_ | ~auVar47._0_8_ & auVar24._0_8_;
            auVar22 = ~auVar47 & auVar22 | auVar24 & auVar47;
            auVar23._8_4_ = -(uint)(auVar22._8_4_ < auVar26._8_4_);
            auVar23._4_4_ = auVar23._8_4_;
            auVar23._0_4_ = auVar23._8_4_;
            auVar23._12_4_ = auVar23._8_4_;
            *pauVar15 = ~auVar27 & auVar20 | auVar45 & auVar27;
            pauVar15[1] = ~auVar23 & auVar22 | auVar26 & auVar23;
            pauVar15[2] = auVar22 & auVar23 | ~auVar23 & auVar26;
            pauVar15 = pauVar15 + 3;
            uVar10 = local_f90;
            auVar22 = local_fd8;
          }
        }
      }
      goto LAB_00d0d609;
    }
    if (pauVar15 == (undefined1 (*) [16])&local_f78) {
      return local_101c._0_1_;
    }
  }
  goto LAB_00d0dba5;
LAB_00d0da80:
  do {
    local_f98 = uVar10;
    lVar13 = -0x10;
    bVar14 = 0;
    do {
      uVar9 = *(uint *)(lVar12 + lVar13);
      if ((ulong)uVar9 == 0xffffffff) break;
      this = (context->scene->geometries).items[uVar9].ptr;
      context->geomID = uVar9;
      context->primID = *(uint *)(lVar12 + 0x10 + lVar13);
      bVar8 = Geometry::pointQuery(this,query,context);
      bVar14 = bVar14 | bVar8;
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0);
    uVar10 = CONCAT71((int7)(local_f98 >> 8),(byte)local_f98 | bVar14);
    local_f90 = local_f90 + 1;
    lVar12 = lVar12 + 0xe0;
  } while (local_f90 != local_fa0);
  auVar22 = local_fd8;
  if ((local_f98 & 1) != 0 || bVar14 != 0) {
    local_fb8 = (context->query_radius).field_0.m128[0];
    local_f88 = (context->query_radius).field_0.m128[1];
    fStack_fe4 = (context->query_radius).field_0.m128[2];
    local_fc8._4_4_ = (context->query_radius).field_0.m128[3];
    local_fe8 = fStack_fe4;
    fStack_fe0 = fStack_fe4;
    fStack_fdc = fStack_fe4;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      _local_fc8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      local_fc8._4_4_ = (float)local_fc8._4_4_ * (float)local_fc8._4_4_;
      local_fc8._0_4_ = fStack_fe4 * fStack_fe4 + local_f88 * local_f88 + local_fb8 * local_fb8;
      fStack_fc0 = fStack_fe4 * fStack_fe4;
      fStack_fbc = (float)local_fc8._4_4_;
    }
    local_f90 = CONCAT71((int7)(local_f90 >> 8),1);
    local_101c = (undefined4)local_f90;
    fStack_fb4 = local_fb8;
    fStack_fb0 = local_fb8;
    fStack_fac = local_fb8;
    fStack_f84 = local_f88;
    fStack_f80 = local_f88;
    fStack_f7c = local_f88;
  }
LAB_00d0dba5:
  fVar16 = local_fb8 * local_fb8;
  fVar17 = fStack_fb4 * fStack_fb4;
  fVar18 = fStack_fb0 * fStack_fb0;
  fVar19 = fStack_fac * fStack_fac;
  if (pauVar15 == (undefined1 (*) [16])&local_f78) {
    return local_101c._0_1_;
  }
  goto LAB_00d0d5bb;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }